

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O0

uint32_t __thiscall
Bitmap::drawBarcode(Bitmap *this,uint32_t x,uint32_t y,uint32_t weight,uint32_t height,
                   uint32_t value)

{
  byte bVar1;
  uint32_t uVar2;
  int32_t pixel_00;
  uint local_50;
  uint32_t j;
  bool value_1;
  uint32_t i;
  uint32_t pixel;
  uint32_t cursor;
  uint32_t barcodeLength;
  uint8_t barcode [9];
  uint32_t value_local;
  uint32_t height_local;
  uint32_t weight_local;
  uint32_t y_local;
  uint32_t x_local;
  Bitmap *this_local;
  
  if (height == 0) {
    this_local._4_4_ = 0;
  }
  else {
    barcode._1_4_ = value;
    barcode._5_4_ = height;
    uVar2 = BarcodeEan8::intToBarcode(value,(uint8_t *)((long)&cursor + 3));
    i = x;
    for (j = 0; j < uVar2; j = j + 1) {
      bVar1 = *(byte *)((long)&cursor + (ulong)(j >> 3) + 3);
      for (local_50 = 0; local_50 < weight; local_50 = local_50 + 1) {
        pixel_00 = getPixelIndex(this,i,y);
        setPixelValue(this,pixel_00,((uint)bVar1 & 0x80 >> ((byte)j & 7)) != 0);
        i = i + 1;
      }
    }
    duplicateLineDown(this,y,barcode._5_4_ - 1);
    this_local._4_4_ = weight * uVar2;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t Bitmap::drawBarcode(uint32_t x, uint32_t y, uint32_t weight, uint32_t height, uint32_t value)
{
   if (height > 0)
   {
      uint8_t barcode[9];
      uint32_t barcodeLength;
      uint32_t cursor;
      uint32_t pixel;

      //get encode barcode
      barcodeLength = BarcodeEan8::intToBarcode(value, barcode);
      //draw one barcode line
      cursor = x;
      for (uint32_t i = 0; i < barcodeLength; ++i)
      {
         bool value = ((barcode[i/8] & (0x80 >> (i & 7))) != 0); //get respective bit
         for (uint32_t j = 0; j < weight; ++j)
         {
            pixel = getPixelIndex(cursor++, y);
            setPixelValue(pixel, value);
         }
      }

      //duplicate that line (height - 1)-times
      duplicateLineDown(y, height - 1);
      return weight * barcodeLength;
   }
   return 0;
}